

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O1

void cft1st(size_t n,float *a,float *w)

{
  ulong uVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar6 = *a + a[2];
  fVar7 = a[1] + a[3];
  fVar4 = *a - a[2];
  fVar3 = a[1] - a[3];
  fVar8 = a[4] + a[6];
  fVar10 = a[5] + a[7];
  fVar5 = a[4] - a[6];
  fVar9 = a[5] - a[7];
  *a = fVar6 + fVar8;
  a[1] = fVar7 + fVar10;
  a[4] = fVar6 - fVar8;
  a[5] = fVar7 - fVar10;
  a[2] = fVar4 - fVar9;
  a[3] = fVar3 + fVar5;
  a[6] = fVar9 + fVar4;
  a[7] = fVar3 - fVar5;
  fVar3 = w[2];
  fVar8 = a[8] + a[10];
  fVar9 = a[9] + a[0xb];
  fVar4 = a[8] - a[10];
  fVar6 = a[9] - a[0xb];
  fVar10 = a[0xc] + a[0xe];
  fVar12 = a[0xd] + a[0xf];
  fVar5 = a[0xc] - a[0xe];
  fVar7 = a[0xd] - a[0xf];
  a[8] = fVar8 + fVar10;
  a[9] = fVar9 + fVar12;
  a[0xc] = fVar12 - fVar9;
  a[0xd] = fVar8 - fVar10;
  fVar8 = fVar4 - fVar7;
  fVar9 = fVar6 + fVar5;
  a[10] = (fVar8 - fVar9) * fVar3;
  a[0xb] = (fVar9 + fVar8) * fVar3;
  fVar7 = fVar7 + fVar4;
  fVar5 = fVar5 - fVar6;
  a[0xe] = (fVar5 - fVar7) * fVar3;
  a[0xf] = (fVar5 + fVar7) * fVar3;
  if (0x10 < n) {
    uVar1 = 0x10;
    lVar2 = 0xc;
    do {
      fVar3 = *(float *)((long)w + lVar2 + -4);
      fVar4 = *(float *)((long)w + lVar2);
      fVar5 = *(float *)((long)w + uVar1);
      fVar6 = *(float *)((long)w + uVar1 + 4);
      fVar10 = fVar5 - (fVar4 + fVar4) * fVar6;
      fVar14 = a[uVar1] + a[uVar1 + 2];
      fVar15 = a[uVar1 + 1] + a[uVar1 + 3];
      fVar11 = a[uVar1] - a[uVar1 + 2];
      fVar9 = a[uVar1 + 1] - a[uVar1 + 3];
      fVar16 = a[uVar1 + 4] + a[uVar1 + 6];
      fVar17 = a[uVar1 + 5] + a[uVar1 + 7];
      fVar13 = a[uVar1 + 4] - a[uVar1 + 6];
      fVar12 = a[uVar1 + 5] - a[uVar1 + 7];
      a[uVar1] = fVar14 + fVar16;
      a[uVar1 + 1] = fVar15 + fVar17;
      fVar7 = fVar9 + fVar13;
      fVar8 = (fVar4 + fVar4) * fVar5 - fVar6;
      fVar14 = fVar14 - fVar16;
      fVar15 = fVar15 - fVar17;
      a[uVar1 + 4] = fVar3 * fVar14 - fVar15 * fVar4;
      a[uVar1 + 5] = fVar14 * fVar4 + fVar3 * fVar15;
      fVar14 = fVar11 - fVar12;
      a[uVar1 + 2] = fVar5 * fVar14 - fVar7 * fVar6;
      a[uVar1 + 3] = fVar7 * fVar5 + fVar14 * fVar6;
      fVar12 = fVar12 + fVar11;
      fVar9 = fVar9 - fVar13;
      a[uVar1 + 6] = fVar10 * fVar12 - fVar9 * fVar8;
      a[uVar1 + 7] = fVar9 * fVar10 + fVar12 * fVar8;
      fVar12 = a[uVar1 + 8] + a[uVar1 + 10];
      fVar13 = a[uVar1 + 9] + a[uVar1 + 0xb];
      fVar16 = a[uVar1 + 0xc] + a[uVar1 + 0xe];
      fVar7 = a[uVar1 + 0xd] + a[uVar1 + 0xf];
      fVar11 = fVar12 - fVar16;
      fVar14 = fVar13 - fVar7;
      fVar5 = *(float *)((long)w + uVar1 + 0xc);
      fVar6 = *(float *)((long)w + uVar1 + 8);
      fVar10 = fVar6 - (fVar3 + fVar3) * fVar5;
      fVar17 = a[uVar1 + 8] - a[uVar1 + 10];
      fVar8 = a[uVar1 + 9] - a[uVar1 + 0xb];
      fVar15 = a[uVar1 + 0xc] - a[uVar1 + 0xe];
      fVar9 = a[uVar1 + 0xd] - a[uVar1 + 0xf];
      a[uVar1 + 8] = fVar12 + fVar16;
      a[uVar1 + 9] = fVar13 + fVar7;
      a[uVar1 + 0xc] = -fVar4 * fVar11 - fVar14 * fVar3;
      fVar7 = fVar8 + fVar15;
      a[uVar1 + 0xd] = fVar11 * fVar3 - fVar4 * fVar14;
      fVar4 = fVar17 - fVar9;
      a[uVar1 + 10] = fVar6 * fVar4 - fVar7 * fVar5;
      fVar3 = (fVar3 + fVar3) * fVar6 - fVar5;
      a[uVar1 + 0xb] = fVar7 * fVar6 + fVar4 * fVar5;
      fVar9 = fVar9 + fVar17;
      fVar8 = fVar8 - fVar15;
      a[uVar1 + 0xe] = fVar10 * fVar9 - fVar8 * fVar3;
      a[uVar1 + 0xf] = fVar8 * fVar10 + fVar9 * fVar3;
      uVar1 = uVar1 + 0x10;
      lVar2 = lVar2 + 8;
    } while (uVar1 < n);
  }
  return;
}

Assistant:

static void cft1st(size_t n, float *a, float *w)
{
    size_t j, k1, k2;
    float wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    x0r = a[0] + a[2];
    x0i = a[1] + a[3];
    x1r = a[0] - a[2];
    x1i = a[1] - a[3];
    x2r = a[4] + a[6];
    x2i = a[5] + a[7];
    x3r = a[4] - a[6];
    x3i = a[5] - a[7];
    a[0] = x0r + x2r;
    a[1] = x0i + x2i;
    a[4] = x0r - x2r;
    a[5] = x0i - x2i;
    a[2] = x1r - x3i;
    a[3] = x1i + x3r;
    a[6] = x1r + x3i;
    a[7] = x1i - x3r;
    wk1r = w[2];
    x0r = a[8] + a[10];
    x0i = a[9] + a[11];
    x1r = a[8] - a[10];
    x1i = a[9] - a[11];
    x2r = a[12] + a[14];
    x2i = a[13] + a[15];
    x3r = a[12] - a[14];
    x3i = a[13] - a[15];
    a[8] = x0r + x2r;
    a[9] = x0i + x2i;
    a[12] = x2i - x0i;
    a[13] = x0r - x2r;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[10] = wk1r * (x0r - x0i);
    a[11] = wk1r * (x0r + x0i);
    x0r = x3i + x1r;
    x0i = x3r - x1i;
    a[14] = wk1r * (x0i - x0r);
    a[15] = wk1r * (x0i + x0r);
    k1 = 0;
    for (j = 16; j < n; j += 16) {
        k1 += 2;
        k2 = 2 * k1;
        wk2r = w[k1];
        wk2i = w[k1 + 1];
        wk1r = w[k2];
        wk1i = w[k2 + 1];
        wk3r = wk1r - 2 * wk2i * wk1i;
        wk3i = 2 * wk2i * wk1r - wk1i;
        x0r = a[j] + a[j + 2];
        x0i = a[j + 1] + a[j + 3];
        x1r = a[j] - a[j + 2];
        x1i = a[j + 1] - a[j + 3];
        x2r = a[j + 4] + a[j + 6];
        x2i = a[j + 5] + a[j + 7];
        x3r = a[j + 4] - a[j + 6];
        x3i = a[j + 5] - a[j + 7];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        x0r -= x2r;
        x0i -= x2i;
        a[j + 4] = wk2r * x0r - wk2i * x0i;
        a[j + 5] = wk2r * x0i + wk2i * x0r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j + 2] = wk1r * x0r - wk1i * x0i;
        a[j + 3] = wk1r * x0i + wk1i * x0r;
        x0r = x1r + x3i;
        x0i = x1i - x3r;
        a[j + 6] = wk3r * x0r - wk3i * x0i;
        a[j + 7] = wk3r * x0i + wk3i * x0r;
        wk1r = w[k2 + 2];
        wk1i = w[k2 + 3];
        wk3r = wk1r - 2 * wk2r * wk1i;
        wk3i = 2 * wk2r * wk1r - wk1i;
        x0r = a[j + 8] + a[j + 10];
        x0i = a[j + 9] + a[j + 11];
        x1r = a[j + 8] - a[j + 10];
        x1i = a[j + 9] - a[j + 11];
        x2r = a[j + 12] + a[j + 14];
        x2i = a[j + 13] + a[j + 15];
        x3r = a[j + 12] - a[j + 14];
        x3i = a[j + 13] - a[j + 15];
        a[j + 8] = x0r + x2r;
        a[j + 9] = x0i + x2i;
        x0r -= x2r;
        x0i -= x2i;
        a[j + 12] = -wk2i * x0r - wk2r * x0i;
        a[j + 13] = -wk2i * x0i + wk2r * x0r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j + 10] = wk1r * x0r - wk1i * x0i;
        a[j + 11] = wk1r * x0i + wk1i * x0r;
        x0r = x1r + x3i;
        x0i = x1i - x3r;
        a[j + 14] = wk3r * x0r - wk3i * x0i;
        a[j + 15] = wk3r * x0i + wk3i * x0r;
    }
}